

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_tab_len(jit_State *J)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ushort *puVar4;
  long in_RDI;
  IRIns *key;
  IRIns *href;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  IRRef tab;
  IRRef in_stack_ffffffffffffffc0;
  IRRef in_stack_ffffffffffffffc4;
  jit_State *in_stack_ffffffffffffffc8;
  jit_State *in_stack_ffffffffffffffd0;
  uint local_1c;
  uint local_18;
  TRef local_4;
  
  local_18 = (uint)*(ushort *)(in_RDI + 0xa0);
  if (local_18 < *(ushort *)(in_RDI + 0x212)) {
    local_18 = (uint)*(ushort *)(in_RDI + 0x212);
  }
  uVar2 = *(ushort *)(in_RDI + 0x214);
  while (local_1c = (uint)uVar2, local_18 < local_1c) {
    puVar4 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)local_1c * 8);
    in_stack_ffffffffffffffd0 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)*puVar4 * 8);
    in_stack_ffffffffffffffc8 =
         (jit_State *)
         (*(long *)(in_RDI + 0x10) +
         (ulong)*(ushort *)((long)&(in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 + 2) * 8);
    if ((in_stack_ffffffffffffffc8->cur).gct == '\x1e') {
      bVar1 = *(byte *)(*(long *)(in_RDI + 0x10) + 4 +
                       (ulong)(ushort)(in_stack_ffffffffffffffc8->cur).nextgc.gcptr32 * 8);
    }
    else {
      bVar1 = (in_stack_ffffffffffffffc8->cur).marked;
    }
    in_stack_ffffffffffffffc4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc4);
    if ((bVar1 & 0x1f) == 0xe) break;
    uVar2 = puVar4[3];
  }
  iVar3 = fwd_aa_tab_clear(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                           in_stack_ffffffffffffffc0);
  if (iVar3 == 0) {
    local_4 = lj_ir_emit(in_stack_ffffffffffffffd0);
  }
  else {
    local_4 = lj_opt_cselim(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  }
  return local_4;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_tab_len(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Any ASTORE is a conflict and limits the search. */
  if (J->chain[IR_ASTORE] > lim) lim = J->chain[IR_ASTORE];

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for TLEN. */
      break;
    }
    ref = store->prev;
  }

  /* Search for aliasing table.clear. */
  if (!fwd_aa_tab_clear(J, lim, tab))
    return lj_ir_emit(J);

  /* Try to find a matching load. Below the conflicting store, if any. */
  return lj_opt_cselim(J, lim);
}